

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.cpp
# Opt level: O2

void __thiscall Color::upgrade(Color *this)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  
  uVar3 = this->_value;
  if ((uVar3 & 0xa0000000) != 0) {
    return;
  }
  if (((uint)uVar3 >> 0x1b & 1) != 0) {
    uVar3 = (ulong)(((uint)uVar3 & 0xff) - 1 & 0xf7ffffff) | uVar3 & 0xffffffff5fffff00;
  }
  uVar1 = (uint)uVar3;
  if ((uVar1 >> 0x1c & 1) != 0) {
    iVar2 = 0x700;
    if ((uVar1 >> 0x18 & 1) == 0) {
      iVar2 = -0x100;
    }
    uVar3 = (ulong)(iVar2 + (uVar1 & 0xff00) & 0xefffff00) | uVar3 & 0xfffffffffeff00ff;
  }
  this->_value = uVar3 | 0x20000000;
  return;
}

Assistant:

void Color::upgrade ()
{
  if ((_value & _COLOR_256) ||
      (_value & _COLOR_24BIT)) return;

  if (_value & _COLOR_HASFG)
  {
    unsigned int fg = _value & _COLOR_FG;
    _value &= ~_COLOR_FG;
    _value |= fg - 1;
  }

  if (_value & _COLOR_HASBG)
  {
    bool bright = _value & _COLOR_BRIGHT;
    unsigned int bg = (_value & _COLOR_BG) >> 8;
    _value &= ~_COLOR_BG;
    _value &= ~_COLOR_BRIGHT;
    _value |= (bright ? bg + 7 : bg - 1) << 8;
  }

  _value |= _COLOR_256;
}